

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

error_code __thiscall libtorrent::aux::torrent::initialize_merkle_trees(torrent *this)

{
  vector<aux::merkle_tree,_file_index_t> *this_00;
  pointer *ppmVar1;
  undefined8 *puVar2;
  torrent_info *this_01;
  iterator __position;
  pointer pmVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  file_storage *this_02;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar10;
  int64_t iVar11;
  ulong uVar12;
  system_error_category *psVar13;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar14;
  long lVar15;
  ulong uVar16;
  file_index_t index;
  span<const_char> piece_layer;
  error_code eVar17;
  error_code eVar18;
  int local_40;
  int local_3c;
  char *local_38;
  
  bVar6 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  psVar13 = &boost::system::detail::cat_holder<void>::system_category_instance;
  if (bVar6) {
    uVar9 = 0;
    uVar16 = 0;
    uVar12 = 0;
  }
  else {
    this_01 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar7 = (this_01->m_flags).m_val >> 4;
    this_02 = torrent_info::orig_files(this_01);
    this_00 = &this->m_merkle_trees;
    iVar8 = file_storage::num_files(this_02);
    ::std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
    reserve(&this_00->
             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
            ,(long)iVar8);
    iVar10 = file_storage::file_range(this_02);
    sVar14 = iVar10._end.m_val;
    if (iVar10._begin.m_val.m_val != sVar14.m_val) {
      lVar15 = (long)iVar10._begin.m_val.m_val * 0x30;
      do {
        index.m_val = (int)iVar10._begin.m_val;
        bVar6 = file_storage::pad_file_at(this_02,index);
        if (bVar6) {
LAB_0030a515:
          __position._M_current =
               (this->m_merkle_trees).
               super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               .
               super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_merkle_trees).
              super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
              .
              super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
            _M_realloc_insert<>(&this_00->
                                 super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                ,__position);
          }
          else {
            ((__position._M_current)->m_block_verified).m_buf.
            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false> =
                 (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
            (__position._M_current)->m_num_blocks = 0;
            (__position._M_current)->m_blocks_per_piece_log = '\0';
            (__position._M_current)->m_mode = uninitialized_tree;
            *(undefined2 *)&(__position._M_current)->field_0x2e = 0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__position._M_current)->m_root = (char *)0x0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ppmVar1 = &(this->m_merkle_trees).
                       super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       .
                       super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
        }
        else {
          iVar11 = file_storage::file_size(this_02,index);
          if (iVar11 == 0) goto LAB_0030a515;
          local_3c = file_storage::file_num_blocks(this_02,index);
          local_40 = file_storage::blocks_per_piece(this_02);
          local_38 = file_storage::root_ptr(this_02,index);
          ::std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>::
          emplace_back<int,int,char_const*>
                    ((vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>
                      *)this_00,&local_3c,&local_40,&local_38);
          piece_layer = torrent_info::piece_layer
                                  ((this->super_torrent_hot_members).m_torrent_file.
                                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,index);
          if (piece_layer.m_len == 0) {
            bVar7 = 0;
          }
          else {
            bVar6 = merkle_tree::load_piece_layer
                              ((merkle_tree *)
                               ((long)&((this_00->
                                        super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                        ).
                                        super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_root + lVar15)
                               ,piece_layer);
            if (!bVar6) {
              pmVar3 = (this_00->
                       super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       ).
                       super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)((long)&pmVar3->m_root + lVar15) = 0;
              pvVar4 = *(void **)((long)&pmVar3->m_tree + lVar15);
              lVar5 = *(long *)((long)&pmVar3->m_tree + lVar15 + 0x10U);
              puVar2 = (undefined8 *)((long)&pmVar3->m_tree + lVar15);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)&pmVar3->m_tree + lVar15 + 0x10U) = 0;
              if (pvVar4 != (void *)0x0) {
                operator_delete(pvVar4,lVar5 - (long)pvVar4);
              }
              pvVar4 = *(void **)((long)&pmVar3->m_block_verified + lVar15);
              *(undefined8 *)((long)&pmVar3->m_block_verified + lVar15) = 0;
              if (pvVar4 != (void *)0x0) {
                operator_delete__(pvVar4);
              }
              *(undefined2 *)((long)&pmVar3->m_blocks_per_piece_log + lVar15) = 0;
              *(undefined4 *)((long)&pmVar3->m_num_blocks + lVar15) = 0;
              this->field_0x5db = this->field_0x5db & 0xf7;
              eVar18 = errors::make_error_code(torrent_invalid_piece_layer);
              psVar13 = (system_error_category *)eVar18.cat_;
              uVar12 = eVar18._0_8_ & 0xffffff0000000000;
              uVar16 = eVar18._0_8_ & 0xff00000000;
              uVar9 = (ulong)(uint)eVar18.val_;
              goto LAB_0030a596;
            }
          }
        }
        lVar15 = lVar15 + 0x30;
        iVar10._begin.m_val = index.m_val + 1;
        iVar10._end.m_val = 0;
      } while (sVar14.m_val != iVar10._begin.m_val);
    }
    *(uint *)&this->field_0x5d8 =
         *(uint *)&this->field_0x5d8 & 0xf7ffffff | (uint)(bVar7 & 1) << 0x1b;
    torrent_info::free_piece_layers
              ((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar9 = 0;
    uVar16 = 0;
    uVar12 = 0;
    psVar13 = &boost::system::detail::cat_holder<void>::system_category_instance;
  }
LAB_0030a596:
  eVar17._0_8_ = uVar9 | uVar16 | uVar12;
  eVar17.cat_ = &psVar13->super_error_category;
  return eVar17;
}

Assistant:

error_code torrent::initialize_merkle_trees()
	{
		if (!info_hash().has_v2()) return {};

		bool valid = m_torrent_file->v2_piece_hashes_verified();

		file_storage const& fs = m_torrent_file->orig_files();
		m_merkle_trees.reserve(fs.num_files());
		for (file_index_t i : fs.file_range())
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
			{
				m_merkle_trees.emplace_back();
				continue;
			}
			m_merkle_trees.emplace_back(fs.file_num_blocks(i)
				, fs.blocks_per_piece(), fs.root_ptr(i));
			auto const piece_layer = m_torrent_file->piece_layer(i);
			if (piece_layer.empty())
			{
				valid = false;
				continue;
			}

			if (!m_merkle_trees[i].load_piece_layer(piece_layer))
			{
				m_merkle_trees[i] = aux::merkle_tree();
				m_v2_piece_layers_validated = false;
				return errors::torrent_invalid_piece_layer;
			}
		}

		m_v2_piece_layers_validated = valid;

		m_torrent_file->free_piece_layers();
		return {};
	}